

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulkan.c
# Opt level: O0

char ** glfwGetRequiredInstanceExtensions(uint32_t *count)

{
  GLFWbool GVar1;
  uint32_t *count_local;
  
  if (count != (uint32_t *)0x0) {
    *count = 0;
    if (_glfw.initialized == 0) {
      _glfwInputError(0x10001,(char *)0x0);
      count_local = (uint32_t *)0x0;
    }
    else {
      GVar1 = _glfwInitVulkan(2);
      if (GVar1 == 0) {
        count_local = (uint32_t *)0x0;
      }
      else if (_glfw.vk.extensions[0] == (char *)0x0) {
        count_local = (uint32_t *)0x0;
      }
      else {
        *count = 2;
        count_local = (uint32_t *)_glfw.vk.extensions;
      }
    }
    return (char **)count_local;
  }
  __assert_fail("count != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/charles-lunarg[P]vk-bootstrap/build_O0/_deps/glfw-src/src/vulkan.c"
                ,0xeb,"const char **glfwGetRequiredInstanceExtensions(uint32_t *)");
}

Assistant:

GLFWAPI const char** glfwGetRequiredInstanceExtensions(uint32_t* count)
{
    assert(count != NULL);

    *count = 0;

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (!_glfwInitVulkan(_GLFW_REQUIRE_LOADER))
        return NULL;

    if (!_glfw.vk.extensions[0])
        return NULL;

    *count = 2;
    return (const char**) _glfw.vk.extensions;
}